

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>
pbrt::MIPMap::CreateFromFile
          (string *filename,MIPMapFilterOptions *options,WrapMode wrapMode,
          ColorEncodingHandle *encoding,Allocator alloc)

{
  float fVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  bool bVar2;
  int iVar3;
  Point2i PVar4;
  reference pvVar5;
  array<pbrt::WrapMode,_2> in_RSI;
  MIPMap *in_RDI;
  string *this;
  MIPMapFilterOptions *in_R8;
  ColorEncodingHandle *in_stack_00000148;
  string *in_stack_00000150;
  Allocator in_stack_00000158;
  RGBColorSpace *colorSpace;
  int x;
  int y;
  bool allOne;
  ImageChannelDesc rgbDesc;
  ImageChannelDesc rgbaDesc;
  Image *image;
  ImageAndMetadata imageAndMetadata;
  Image *in_stack_fffffffffffff6a8;
  undefined7 in_stack_fffffffffffff6b0;
  undefined1 in_stack_fffffffffffff6b7;
  undefined4 in_stack_fffffffffffff6b8;
  WrapMode in_stack_fffffffffffff6bc;
  WrapMode2D *in_stack_fffffffffffff6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d8;
  allocator<char> *in_stack_fffffffffffff6e0;
  char *in_stack_fffffffffffff6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  string *local_8a8;
  Image *in_stack_fffffffffffff788;
  Image *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_t in_stack_fffffffffffff798;
  string *desc;
  Image *this_01;
  Allocator alloc_00;
  _Head_base<0UL,_pbrt::MIPMap_*,_false> this_02;
  Tuple2<pbrt::Point2,_int> p;
  int local_428;
  int local_420;
  int iStack_418;
  int local_414;
  allocator<char> local_40b;
  allocator<char> local_40a;
  undefined1 local_409 [9];
  undefined1 local_400 [179];
  undefined1 local_34d;
  undefined1 local_34c [12];
  memory_resource local_340 [4];
  memory_resource local_320 [4];
  memory_resource local_300 [4];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [704];
  
  p = (Tuple2<pbrt::Point2,_int>)((long)local_2c0 + 0x68);
  this_02._M_head_impl = in_RDI;
  ColorEncodingHandle::ColorEncodingHandle
            ((ColorEncodingHandle *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),
             (ColorEncodingHandle *)in_stack_fffffffffffff6a8);
  Image::Read(in_stack_00000150,in_stack_00000158,in_stack_00000148);
  local_2c0._96_8_ = (Image *)(local_2c0 + 0x78);
  iVar3 = Image::NChannels((Image *)0x5bde7b);
  if (iVar3 != 1) {
    local_34d = 1;
    local_34c._4_8_ = local_340;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    local_34c._4_8_ = local_320;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    local_34c._4_8_ = local_300;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    this_01 = (Image *)local_2e0;
    alloc_00.memoryResource = (memory_resource *)local_34c;
    local_34c._4_8_ = this_01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    local_34d = 0;
    local_2c0._0_8_ = local_340;
    local_2c0._8_8_ = 4;
    v._M_array._4_4_ = in_stack_fffffffffffff6bc;
    v._M_array._0_4_ = in_stack_fffffffffffff6b8;
    v._M_len = (size_type)in_stack_fffffffffffff6c0;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),v);
    requestedChannels.n = in_stack_fffffffffffff798;
    requestedChannels.ptr = in_stack_fffffffffffff790;
    Image::GetChannelDesc(in_stack_fffffffffffff788,requestedChannels);
    this = (string *)local_2c0;
    do {
      this = this + -0x20;
      std::__cxx11::string::~string(this);
    } while (this != (string *)local_340);
    desc = this;
    std::allocator<char>::~allocator((allocator<char> *)local_34c);
    std::allocator<char>::~allocator((allocator<char> *)(local_34c + 1));
    std::allocator<char>::~allocator((allocator<char> *)(local_34c + 2));
    std::allocator<char>::~allocator((allocator<char> *)(local_34c + 3));
    this_00 = (Image *)local_400;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_409;
    local_409._1_8_ = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    local_409._1_8_ = local_400 + 0x20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    local_409._1_8_ = local_400 + 0x40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
    local_400._96_8_ = local_400;
    local_400._104_8_ = 3;
    v_00._M_array._4_4_ = in_stack_fffffffffffff6bc;
    v_00._M_array._0_4_ = in_stack_fffffffffffff6b8;
    v_00._M_len = (size_type)in_stack_fffffffffffff6c0;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),v_00);
    requestedChannels_00.n = (size_t)this;
    requestedChannels_00.ptr = pbVar6;
    Image::GetChannelDesc(this_00,requestedChannels_00);
    local_8a8 = (string *)(local_400 + 0x60);
    do {
      local_8a8 = local_8a8 + -0x20;
      std::__cxx11::string::~string(local_8a8);
    } while (local_8a8 != (string *)local_400);
    std::allocator<char>::~allocator(&local_40b);
    std::allocator<char>::~allocator(&local_40a);
    std::allocator<char>::~allocator((allocator<char> *)local_409);
    bVar2 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5be2b3);
    if (bVar2) {
      bVar2 = true;
      local_414 = 0;
      while( true ) {
        PVar4 = Image::Resolution((Image *)local_2c0._96_8_);
        iStack_418 = PVar4.super_Tuple2<pbrt::Point2,_int>.y;
        if (iStack_418 <= local_414) break;
        local_420 = 0;
        while( true ) {
          PVar4 = Image::Resolution((Image *)local_2c0._96_8_);
          local_428 = PVar4.super_Tuple2<pbrt::Point2,_int>.x;
          if (local_428 <= local_420) break;
          Point2<int>::Point2((Point2<int> *)
                              CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),
                              (int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
                              (int)in_stack_fffffffffffff6a8);
          WrapMode2D::WrapMode2D(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
          Image::GetChannels((Image *)this_02._M_head_impl,(Point2i)p,(ImageChannelDesc *)in_RDI,
                             (WrapMode2D)in_RSI.values);
          pvVar5 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                              CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),
                              (size_type)in_stack_fffffffffffff6a8);
          fVar1 = *pvVar5;
          ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5be415);
          if ((fVar1 != 1.0) || (NAN(fVar1))) {
            bVar2 = false;
          }
          local_420 = local_420 + 1;
        }
        local_414 = local_414 + 1;
      }
      if (bVar2) {
        Image::SelectChannels(this_01,(ImageChannelDesc *)desc,alloc_00);
        Image::operator=((Image *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),
                         in_stack_fffffffffffff6a8);
        Image::~Image((Image *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0));
      }
      else {
        Image::SelectChannels(this_01,(ImageChannelDesc *)desc,alloc_00);
        Image::operator=((Image *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),
                         in_stack_fffffffffffff6a8);
        Image::~Image((Image *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0));
      }
    }
    else {
      in_stack_fffffffffffff6b7 =
           ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5be842);
      if (!(bool)in_stack_fffffffffffff6b7) {
        ErrorExit<std::__cxx11::string_const&>
                  ((char *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
      }
      Image::SelectChannels(this_01,(ImageChannelDesc *)desc,alloc_00);
      Image::operator=((Image *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),
                       in_stack_fffffffffffff6a8);
      Image::~Image((Image *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0));
    }
    ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5be8fa);
    ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5be907);
  }
  ImageMetadata::GetColorSpace((ImageMetadata *)in_stack_fffffffffffff6a8);
  std::
  make_unique<pbrt::MIPMap,pbrt::Image,pbrt::RGBColorSpace_const*&,pbrt::WrapMode&,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::MIPMapFilterOptions_const&>
            ((Image *)p,(RGBColorSpace **)in_RSI.values,(WrapMode *)this_02._M_head_impl,
             (polymorphic_allocator<std::byte> *)in_RDI,in_R8);
  ImageAndMetadata::~ImageAndMetadata
            ((ImageAndMetadata *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0));
  return (__uniq_ptr_data<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>,_true,_true>)
         (tuple<pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>)this_02._M_head_impl;
}

Assistant:

std::unique_ptr<MIPMap> MIPMap::CreateFromFile(const std::string &filename,
                                               const MIPMapFilterOptions &options,
                                               WrapMode wrapMode,
                                               ColorEncodingHandle encoding,
                                               Allocator alloc) {
    ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc, encoding);

    Image &image = imageAndMetadata.image;
    if (image.NChannels() != 1) {
        // Get the channels in a canonical order..
        ImageChannelDesc rgbaDesc = image.GetChannelDesc({"R", "G", "B", "A"});
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (rgbaDesc) {
            // Is alpha all ones?
            bool allOne = true;
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    if (image.GetChannels({x, y}, rgbaDesc)[3] != 1)
                        allOne = false;
            if (allOne)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                image = image.SelectChannels(rgbaDesc, alloc);
        } else {
            if (rgbDesc)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                ErrorExit("%s: image doesn't have R, G, and B channels", filename);
        }
    }

    const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();
    return std::make_unique<MIPMap>(std::move(image), colorSpace, wrapMode, alloc,
                                    options);
}